

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
* __thiscall
wallet::anon_unknown_5::WalletLoaderImpl::getWallets
          (vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
           *__return_storage_ptr__,WalletLoaderImpl *this)

{
  pointer wallet;
  long in_FS_OFFSET;
  long *local_50;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetWallets(&local_48,&this->m_context);
  if (local_48.
      super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    wallet = local_48.
             super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      interfaces::MakeWallet((interfaces *)&local_50,&this->m_context,wallet);
      std::
      vector<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>,std::allocator<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>>
      ::emplace_back<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>
                ((vector<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>,std::allocator<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> *)
                 &local_50);
      if (local_50 != (long *)0x0) {
        (**(code **)(*local_50 + 8))();
      }
      wallet = wallet + 1;
    } while (wallet != local_48.
                       super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  _GLOBAL__N_1::std::
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
  ~vector((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
           *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<Wallet>> getWallets() override
    {
        std::vector<std::unique_ptr<Wallet>> wallets;
        for (const auto& wallet : GetWallets(m_context)) {
            wallets.emplace_back(MakeWallet(m_context, wallet));
        }
        return wallets;
    }